

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O3

void __thiscall Js::Profiler::Profiler(Profiler *this,ArenaAllocator *allocator)

{
  long lVar1;
  
  lVar1 = 8;
  do {
    *(undefined2 *)((long)(this->timeStack).itemList + lVar1 + -8) = 0x176;
    *(undefined8 *)((long)&(this->timeStack).itemList[0].tag + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x148);
  (this->timeStack).curIndex = -1;
  UnitData::UnitData(&(this->rootNode).value);
  memset((this->rootNode).children,0,0xbb0);
  this->alloc = allocator;
  this->curNode = &this->rootNode;
  memset(this->inclSumAtLevel,0,0xba8);
  return;
}

Assistant:

Profiler::Profiler(ArenaAllocator * allocator) :
        alloc(allocator),
        rootNode(NULL)
    {
        this->curNode = &this->rootNode;

        for(int i = 0; i < PhaseCount; i++)
        {
            this->inclSumAtLevel[i] = 0;
        }
    }